

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O2

GLuint gl4cts::StencilTexturing::Utils::createAndCompileShader
                 (Context *context,GLenum type,GLchar *code)

{
  ostringstream *this;
  int iVar1;
  GLuint id;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLint length;
  GLint status;
  string message;
  GLchar *code_local;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  long lVar3;
  
  code_local = code;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  id = (**(code **)(lVar3 + 0x3f0))(type);
  status = 0;
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xcf);
  (**(code **)(lVar3 + 0x12b8))(id,1,&code_local,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"ShaderSource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xd4);
  (**(code **)(lVar3 + 0x248))(id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xd8);
  (**(code **)(lVar3 + 0xa70))(id,0x8b81,&status);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xdc);
  if (status != 1) {
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    (**(code **)(lVar3 + 0xa70))(id,0x8b84);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"GetShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0xe6);
    std::__cxx11::string::resize((ulong)&message,'\0');
    (**(code **)(lVar3 + 0xa58))(id,0,0,message._M_dataplus._M_p);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"GetShaderInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0xed);
    local_1a8._0_8_ = context->m_testCtx->m_log;
    this = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Shader (");
    local_1b8.m_getName = glu::getShaderTypeName;
    local_1b8.m_value = type;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this);
    std::operator<<((ostream *)this,") compilation failed: ");
    std::operator<<((ostream *)this,(string *)&message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    deleteShader(context,id);
    std::__cxx11::string::~string((string *)&message);
    id = 0;
  }
  return id;
}

Assistant:

GLuint Utils::createAndCompileShader(deqp::Context& context, const GLenum type, const GLchar* code)
{
	const Functions& gl		= context.getRenderContext().getFunctions();
	GLuint			 id		= gl.createShader(type);
	GLint			 status = GL_FALSE;

	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	try
	{
		gl.shaderSource(id, 1 /* count */, &code, 0 /* lengths */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderSource");

		/* Compile */
		gl.compileShader(id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

		/* Get compilation status */
		gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Log compilation error */
		if (GL_TRUE != status)
		{
			glw::GLint  length = 0;
			std::string message;

			/* Error log length */
			gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

			/* Prepare storage */
			message.resize(length, 0);

			/* Get error log */
			gl.getShaderInfoLog(id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

			context.getTestContext().getLog() << tcu::TestLog::Message << "Shader (" << glu::getShaderTypeStr(type)
											  << ") compilation failed: " << message << tcu::TestLog::EndMessage;

			deleteShader(context, id);
			id = 0;
		}
	}
	catch (std::exception& exc)
	{
		deleteShader(context, id);
		throw exc;
	}

	return id;
}